

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TSS_HMAC(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT handle,BYTE *data,
               UINT32 dataSize,TPM2B_DIGEST *outHMAC)

{
  undefined8 in_stack_fffffffffffffb78;
  undefined4 uVar1;
  undefined1 local_462 [8];
  TPM2B_MAX_BUFFER dataBuf;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TPM2B_DIGEST *pTStack_48;
  TPM_RC result;
  TPM2B_DIGEST *outHMAC_local;
  BYTE *pBStack_38;
  UINT32 dataSize_local;
  BYTE *data_local;
  TSS_SESSION *pTStack_28;
  TPMI_DH_OBJECT handle_local;
  TSS_SESSION *session_local;
  TSS_DEVICE *tpm_local;
  
  uVar1 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  pTStack_48 = outHMAC;
  outHMAC_local._4_4_ = dataSize;
  pBStack_38 = data;
  data_local._4_4_ = handle;
  pTStack_28 = session;
  session_local = (TSS_SESSION *)tpm;
  if (dataSize < 0x401) {
    if ((((tpm == (TSS_DEVICE *)0x0) || (session == (TSS_SESSION *)0x0)) || (data == (BYTE *)0x0))
       || (outHMAC == (TPM2B_DIGEST *)0x0)) {
      dataBuf._1018_8_ = xlogging_get_log_function();
      if ((LOGGER_LOG)dataBuf._1018_8_ != (LOGGER_LOG)0x0) {
        (*(code *)dataBuf._1018_8_)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                   ,"TSS_HMAC",0x1b5,1,
                   "Invalid parameter specified tpm: %p, session: %p, data: %p, outHMAC: %p",
                   session_local,pTStack_28,pBStack_38,pTStack_48);
      }
      l._4_4_ = 0x101;
    }
    else {
      local_462._0_2_ = (undefined2)dataSize;
      MemoryCopy(local_462 + 2,data,dataSize);
      l._4_4_ = TPM2_HMAC((TSS_DEVICE *)session_local,pTStack_28,data_local._4_4_,
                          (TPM2B_MAX_BUFFER *)local_462,0x10,pTStack_48);
    }
  }
  else {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
             ,"TSS_HMAC",0x1b0,1,"Invalid data size specified %u",
             CONCAT44(uVar1,outHMAC_local._4_4_));
    }
    l._4_4_ = 0x95;
  }
  return l._4_4_;
}

Assistant:

TPM_RC TSS_HMAC(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          handle,             // IN
    BYTE                   *data,               // IN
    UINT32                  dataSize,           // IN
    TPM2B_DIGEST           *outHMAC             // OUT
)
{
    TPM_RC result;
    if (dataSize > MAX_DIGEST_BUFFER)
    {
        LogError("Invalid data size specified %u", dataSize);
        result = TPM_RC_SIZE;
    }
    else if (tpm == NULL || session == NULL || data == NULL || outHMAC == NULL)
    {
        LogError("Invalid parameter specified tpm: %p, session: %p, data: %p, outHMAC: %p", tpm, session, data, outHMAC);
        result = TPM_RC_FAILURE;
    }
    else
    {
        TPM2B_MAX_BUFFER    dataBuf;
        dataBuf.b.size = (UINT16)dataSize;
        MemoryCopy(dataBuf.t.buffer, data, dataSize);
        result = TPM2_HMAC(tpm, session, handle, &dataBuf, TPM_ALG_NULL, outHMAC);
    }
    return result;
}